

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_resampler.cc
# Opt level: O0

int webrtc::WebRtcAec_GetSkew(void *resampInst,int rawSkew,float *skewEst)

{
  int local_2c;
  int err;
  AecResampler *obj;
  float *skewEst_local;
  int rawSkew_local;
  void *resampInst_local;
  
  local_2c = 0;
  if (*(int *)((long)resampInst + 0xb48) < 400) {
    *(int *)((long)resampInst + (long)*(int *)((long)resampInst + 0xb48) * 4 + 0x508) = rawSkew;
    *(int *)((long)resampInst + 0xb48) = *(int *)((long)resampInst + 0xb48) + 1;
  }
  else if (*(int *)((long)resampInst + 0xb48) == 400) {
    local_2c = EstimateSkew((int *)((long)resampInst + 0x508),400,*(int *)((long)resampInst + 0x504)
                            ,skewEst);
    *(float *)((long)resampInst + 0xb4c) = *skewEst;
    *(int *)((long)resampInst + 0xb48) = *(int *)((long)resampInst + 0xb48) + 1;
  }
  else {
    *skewEst = *(float *)((long)resampInst + 0xb4c);
  }
  return local_2c;
}

Assistant:

int WebRtcAec_GetSkew(void* resampInst, int rawSkew, float* skewEst) {
  AecResampler* obj = static_cast<AecResampler*>(resampInst);
  int err = 0;

  if (obj->skewDataIndex < kEstimateLengthFrames) {
    obj->skewData[obj->skewDataIndex] = rawSkew;
    obj->skewDataIndex++;
  } else if (obj->skewDataIndex == kEstimateLengthFrames) {
    err = EstimateSkew(obj->skewData, kEstimateLengthFrames,
                       obj->deviceSampleRateHz, skewEst);
    obj->skewEstimate = *skewEst;
    obj->skewDataIndex++;
  } else {
    *skewEst = obj->skewEstimate;
  }

  return err;
}